

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execTasRg<(moira::Instr)124,(moira::Mode)0,(moira::Size)1>(Moira *this,u16 opcode)

{
  uint uVar1;
  uint uVar2;
  
  (*this->_vptr_Moira[0xb])();
  uVar1 = *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  uVar2 = uVar1 & 0xff;
  (this->reg).sr.n = 0x7f < uVar2;
  (this->reg).sr.z = uVar2 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = uVar1 | 0x80;
  prefetch<4ul>(this);
  return;
}

Assistant:

void
Moira::execTasRg(u16 opcode)
{
    signalTAS();
    
    int dst = ( _____________xxx(opcode) );

    u32 ea, data;
    readOp<M,Byte>(dst, ea, data);

    reg.sr.n = NBIT<Byte>(data);
    reg.sr.z = ZERO<Byte>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    data |= 0x80;
    writeD<S>(dst, data);

    prefetch<POLLIPL>();
}